

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator=
          (RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *this,
          PipelineResourceSignatureVkImpl *pObj)

{
  PipelineResourceSignatureVkImpl *pObj_local;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *this_local;
  
  if (this->m_pObject != pObj) {
    if (this->m_pObject != (PipelineResourceSignatureVkImpl *)0x0) {
      DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
      ::Release((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                 *)this->m_pObject);
    }
    this->m_pObject = pObj;
    if (this->m_pObject != (PipelineResourceSignatureVkImpl *)0x0) {
      RefCountedObject<Diligent::IPipelineResourceSignature>::AddRef
                ((RefCountedObject<Diligent::IPipelineResourceSignature> *)this->m_pObject);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }